

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall
VertexAttrib64Bit::LimitTest::getProgramDetails
          (LimitTest *this,_iteration iteration,bool use_arrays,bool use_locations,
          bool use_vertex_attrib_divisor,string *out_varying_name,string *out_vertex_shader_code)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  GLint GVar4;
  GLint *pGVar5;
  GLchar **ppGVar6;
  GLint GVar7;
  GLint GVar8;
  ostream *poVar9;
  LimitTest *this_00;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  GLint n_type;
  int iVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  undefined3 in_register_00000081;
  uint uVar17;
  GLint n_type_00;
  int iVar18;
  GLint attribute;
  int iVar19;
  attributeConfiguration configuration;
  stringstream stream;
  ostream local_1c8;
  string local_50 [32];
  
  configuration.m_n_attributes_per_group = 0;
  configuration.m_type_names = (GLchar **)0x0;
  configuration.m_vertex_length = 0;
  configuration.m_n_elements = (GLint *)0x0;
  configuration.m_n_rows = (GLint *)0x0;
  configuration.m_n_types = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  pcVar11 = "gl_VertexID";
  if (CONCAT31(in_register_00000081,use_vertex_attrib_divisor) != 0) {
    pcVar11 = "gl_InstanceID";
  }
  getVertexArrayConfiguration(this,iteration,&configuration);
  uVar3 = configuration.m_n_types;
  GVar4 = configuration.m_n_attributes_per_group;
  std::operator<<(&local_1c8,
                  "#version 400\n#extension GL_ARB_vertex_attrib_64bit : require\n\nprecision highp float;\n\n"
                 );
  ppGVar6 = configuration.m_type_names;
  uVar17 = 0;
  iVar10 = 0;
  if (0 < GVar4) {
    iVar10 = GVar4;
  }
  if ((int)uVar3 < 1) {
    uVar3 = uVar17;
  }
  for (uVar12 = 0; uVar12 != uVar3; uVar12 = uVar12 + 1) {
    pcVar2 = ppGVar6[uVar12];
    poVar9 = std::operator<<(&local_1c8,"// ");
    this_00 = (LimitTest *)std::operator<<(poVar9,pcVar2);
    std::operator<<((ostream *)this_00,"\n");
    n_type_00 = (GLint)uVar12;
    if (use_arrays) {
      if (use_locations) {
        GVar7 = calculateAttributeLocation(this_00,&configuration,-1,n_type_00);
        poVar9 = std::operator<<(&local_1c8,"layout(location = ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,GVar7);
        std::operator<<(poVar9,") ");
      }
      poVar9 = std::operator<<(&local_1c8,"in ");
      poVar9 = std::operator<<(poVar9,pcVar2);
      poVar9 = std::operator<<(poVar9," attribute_");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,n_type_00);
      poVar9 = std::operator<<(poVar9,"[");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,GVar4);
      std::operator<<(poVar9,"];\n");
    }
    else {
      for (GVar7 = 0; iVar10 != GVar7; GVar7 = GVar7 + 1) {
        if (use_locations) {
          GVar8 = calculateAttributeLocation(this_00,&configuration,GVar7,n_type_00);
          poVar9 = std::operator<<(&local_1c8,"layout(location = ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,GVar8);
          std::operator<<(poVar9,") ");
        }
        poVar9 = std::operator<<(&local_1c8,"in ");
        poVar9 = std::operator<<(poVar9,pcVar2);
        poVar9 = std::operator<<(poVar9," attribute_");
        this_00 = (LimitTest *)std::ostream::operator<<(poVar9,uVar17 + GVar7);
        std::operator<<((ostream *)this_00,";\n");
      }
    }
    std::operator<<(&local_1c8,"\n");
    uVar17 = uVar17 + GVar4;
  }
  poVar9 = std::operator<<(&local_1c8,"out int ");
  poVar9 = std::operator<<(poVar9,"vs_output_value");
  std::operator<<(poVar9,";\n\n");
  std::operator<<(&local_1c8,"void main()\n{\n");
  pGVar5 = configuration.m_n_elements;
  for (uVar12 = 0; uVar12 != uVar3; uVar12 = uVar12 + 1) {
    iVar1 = pGVar5[uVar12];
    pcVar2 = ppGVar6[uVar12];
    poVar9 = std::operator<<(&local_1c8,"// ");
    poVar9 = std::operator<<(poVar9,pcVar2);
    std::operator<<(poVar9,"\n");
    iVar13 = (int)uVar12;
    iVar14 = 0;
    iVar18 = 0;
    if (0 < iVar1) {
      iVar18 = iVar1;
    }
    for (; iVar14 != iVar10; iVar14 = iVar14 + 1) {
      iVar15 = iVar14 + GVar4 * iVar13;
      pcVar16 = "    else if (attribute_";
      if (iVar15 == 0) {
        pcVar16 = "    if (attribute_";
      }
      std::operator<<(&local_1c8,pcVar16);
      if (use_arrays) {
        poVar9 = (ostream *)std::ostream::operator<<(&local_1c8,iVar13);
        poVar9 = std::operator<<(poVar9,"[");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar14);
        std::operator<<(poVar9,"]");
      }
      else {
        std::ostream::operator<<(&local_1c8,iVar15);
      }
      poVar9 = std::operator<<(&local_1c8," != ");
      poVar9 = std::operator<<(poVar9,pcVar2);
      std::operator<<(poVar9,"(");
      if (iteration - DMAT2 < 5) {
        for (iVar19 = 0; iVar18 != iVar19; iVar19 = iVar19 + 1) {
          poVar9 = (ostream *)std::ostream::operator<<(&local_1c8,iVar13);
          poVar9 = std::operator<<(poVar9," + ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar15);
          poVar9 = std::operator<<(poVar9," + ");
          poVar9 = std::operator<<(poVar9,pcVar11);
          poVar9 = std::operator<<(poVar9," * 16 + ");
          std::ostream::operator<<(poVar9,iVar19);
          if (iVar1 + -1 != iVar19) {
            std::operator<<(&local_1c8,", ");
          }
        }
      }
      else if (iteration == DOUBLE_DVEC2) {
        if (iVar1 == 1) {
          poVar9 = (ostream *)std::ostream::operator<<(&local_1c8,iVar15);
          poVar9 = std::operator<<(poVar9," + ");
          poVar9 = std::operator<<(poVar9,pcVar11);
          pcVar16 = " * 2";
        }
        else {
          poVar9 = (ostream *)std::ostream::operator<<(&local_1c8,iVar15);
          poVar9 = std::operator<<(poVar9," + ");
          poVar9 = std::operator<<(poVar9,pcVar11);
          poVar9 = std::operator<<(poVar9," * 3 + 1");
          poVar9 = std::operator<<(poVar9,", ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar15);
          poVar9 = std::operator<<(poVar9," + ");
          poVar9 = std::operator<<(poVar9,pcVar11);
          pcVar16 = " * 3 + 2";
        }
        std::operator<<(poVar9,pcVar16);
      }
      else if (iteration == DVEC3_DVEC4) {
        for (iVar19 = 0; iVar18 != iVar19; iVar19 = iVar19 + 1) {
          poVar9 = (ostream *)std::ostream::operator<<(&local_1c8,iVar15);
          poVar9 = std::operator<<(poVar9," + ");
          poVar9 = std::operator<<(poVar9,pcVar11);
          poVar9 = std::operator<<(poVar9," * ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar1);
          poVar9 = std::operator<<(poVar9," + ");
          std::ostream::operator<<(poVar9,iVar19);
          if (iVar1 + -1 != iVar19) {
            std::operator<<(&local_1c8,", ");
          }
        }
      }
      poVar9 = std::operator<<(&local_1c8,"))\n");
      poVar9 = std::operator<<(poVar9,"    {\n");
      poVar9 = std::operator<<(poVar9,"        ");
      poVar9 = std::operator<<(poVar9,"vs_output_value");
      poVar9 = std::operator<<(poVar9," = 0;\n");
      std::operator<<(poVar9,"    }\n");
    }
  }
  poVar9 = std::operator<<(&local_1c8,"    else\n");
  poVar9 = std::operator<<(poVar9,"    {\n");
  poVar9 = std::operator<<(poVar9,"        ");
  poVar9 = std::operator<<(poVar9,"vs_output_value");
  poVar9 = std::operator<<(poVar9," = 1;\n");
  poVar9 = std::operator<<(poVar9,"    }\n");
  std::operator<<(poVar9,"}\n\n");
  std::__cxx11::string::assign((char *)out_varying_name);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_vertex_shader_code,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void LimitTest::getProgramDetails(_iteration iteration, bool use_arrays, bool use_locations,
								  bool use_vertex_attrib_divisor, std::string& out_varying_name,
								  std::string& out_vertex_shader_code) const
{
	static const GLchar* varying_name = "vs_output_value";

	attributeConfiguration configuration;
	GLint				   n_attributes = 0;
	GLint				   n_types		= 0;
	std::stringstream	  stream;

	const GLchar* advancement_str = (true == use_vertex_attrib_divisor) ? "gl_InstanceID" : "gl_VertexID";

	getVertexArrayConfiguration(iteration, configuration);

	n_attributes = configuration.m_n_attributes_per_group;
	n_types		 = configuration.m_n_types;

	/* Preamble */
	stream << "#version 400\n"
			  "#extension GL_ARB_vertex_attrib_64bit : require\n"
			  "\n"
			  "precision highp float;\n"
			  "\n";

	/* Attribute declarations */
	/* Spearated attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE */
	for (GLint n_type = 0; n_type < n_types; ++n_type)
	{
		const GLint   attribute_offset = n_type * n_attributes;
		const GLchar* type_name		   = configuration.m_type_names[n_type];

		stream << "// " << type_name << "\n";

		if (false == use_arrays)
		{
			for (GLint attribute = 0; attribute < n_attributes; ++attribute)
			{
				if (true == use_locations)
				{
					const GLint location = calculateAttributeLocation(configuration, attribute, n_type);

					stream << "layout(location = " << location << ") ";
				}

				stream << "in " << type_name << " attribute_" << attribute + attribute_offset << ";\n";
			}
		}
		else
		{
			if (true == use_locations)
			{
				const GLint location = calculateAttributeLocation(configuration, m_array_attribute, n_type);

				stream << "layout(location = " << location << ") ";
			}

			stream << "in " << type_name << " attribute_" << n_type << "[" << n_attributes << "];\n";
		}

		stream << "\n";
	}

	/* Varying declaration */
	stream << "out int " << varying_name << ";\n\n";

	/* Main */
	stream << "void main()\n"
			  "{\n";

	for (GLint n_type = 0; n_type < n_types; ++n_type)
	{
		const GLint   n_elements = configuration.m_n_elements[n_type];
		const GLchar* type_name  = configuration.m_type_names[n_type];

		stream << "// " << type_name << "\n";

		/* if (attribute_name != type(values))
		 * {
		 *     varying = 0;
		 * }
		 */
		for (GLint attribute = 0; attribute < n_attributes; ++attribute)
		{
			const GLint attribute_ordinal = attribute + n_type * n_attributes;

			/* First attribute is verified with "if", rest with "else if" */
			if (0 == attribute_ordinal)
			{
				stream << "    if (attribute_";
			}
			else
			{
				stream << "    else if (attribute_";
			}

			/* Spearated attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE[INDEX] */
			if (false == use_arrays)
			{
				stream << attribute_ordinal;
			}
			else
			{
				stream << n_type << "[" << attribute << "]";
			}

			/* != type() */
			stream << " != " << type_name << "(";

			/* Values for type constructor, depend on iteration */
			switch (iteration)
			{
			case DOUBLE_DVEC2:

				/* Double attributes should be assigned the value:
				 (n_attribute + gl_VertexID * 2) */
				/* Dvec2 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 3 + 1,
				 n_attribute + gl_VertexID * 3 + 2)*/

				if (1 == n_elements)
				{
					stream << attribute_ordinal << " + " << advancement_str << " * 2";
				}
				else
				{
					stream << attribute_ordinal << " + " << advancement_str << " * 3 + 1"
						   << ", " << attribute_ordinal << " + " << advancement_str << " * 3 + 2";
				}

				break;

			case DVEC3_DVEC4:

				/* Dvec3 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 3 + 0,
				 n_attribute + gl_VertexID * 3 + 1,
				 n_attribute + gl_VertexID * 3 + 2).

				 Dvec4 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 4 + 0,
				 n_attribute + gl_VertexID * 4 + 1,
				 n_attribute + gl_VertexID * 4 + 2,
				 n_attribute + gl_VertexID * 4 + 3).*/

				for (GLint element = 0; element < n_elements; ++element)
				{
					stream << attribute_ordinal << " + " << advancement_str << " * " << n_elements << " + " << element;

					if (n_elements != element + 1)
					{
						stream << ", ";
					}
				}

				break;

			case DMAT2:
			case DMAT3X2_DMAT4X2:
			case DMAT2X3_DMAT2X4:
			case DMAT3_DMAT3X4:
			case DMAT4X3_DMAT4:

				/* Subsequent matrix elements should be assigned the following value:
				 (n_type + n_attribute + gl_VertexID * 16 + n_value)*/

				for (GLint element = 0; element < n_elements; ++element)
				{
					stream << n_type << " + " << attribute_ordinal << " + " << advancement_str << " * 16 + " << element;

					if (n_elements != element + 1)
					{
						stream << ", ";
					}
				}

				break;
			}

			/* type() { varying = 0 } */
			stream << "))\n"
				   << "    {\n"
				   << "        " << varying_name << " = 0;\n"
				   << "    }\n";
		}
	}

	/* All attributes verified: else { varyin = 1 }
	 Close main body */
	stream << "    else\n"
		   << "    {\n"
		   << "        " << varying_name << " = 1;\n"
		   << "    }\n"
		   << "}\n\n";

	/* Store results */
	out_varying_name	   = varying_name;
	out_vertex_shader_code = stream.str();
}